

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error doContent(XML_Parser parser,int startTagLevel,ENCODING *enc,char *s,char *end,
                   char **nextPtr)

{
  char cVar1;
  undefined8 *puVar2;
  code *pcVar3;
  XML_Error XVar4;
  undefined4 uVar5;
  int iVar6;
  XML_Char *name_00;
  open_internal_entity *poVar7;
  undefined8 uVar8;
  char *ptr;
  STRING_POOL *pool;
  char *pcVar9;
  long local_160;
  ICHAR *dataPtr_1;
  ICHAR *dataPtr;
  XML_Error result_5;
  int iStack_144;
  XML_Char c_1;
  XML_Char buf [4];
  int n;
  BINDING *b_1;
  XML_Char *from;
  XML_Char *to;
  TAG *tag_1;
  char *rawName_1;
  int len;
  BINDING *b;
  TAG_NAME name_1;
  BINDING *bindings;
  XML_Error result_4;
  char *rawName;
  XML_Error result_3;
  int bufSize_1;
  char *fromPtr;
  char *rawNameEnd;
  XML_Char *toPtr;
  XML_Error result_2;
  int bufSize;
  TAG *tag;
  XML_Char *pXStack_a0;
  XML_Error result_1;
  XML_Char *context;
  OPEN_INTERNAL_ENTITY openEntity;
  XML_Error result;
  XML_Char ch;
  ENTITY *entity;
  XML_Char *name;
  XML_Char c;
  char *pcStack_58;
  int tok;
  char *next;
  char **eventEndPP;
  char **eventPP;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  ENCODING *enc_local;
  XML_Parser pvStack_18;
  int startTagLevel_local;
  XML_Parser parser_local;
  
  if (enc == *(ENCODING **)((long)parser + 0x118)) {
    eventEndPP = (char **)((long)parser + 0x218);
    next = (char *)((long)parser + 0x220);
  }
  else {
    eventEndPP = *(char ***)((long)parser + 0x230);
    next = (char *)(*(long *)((long)parser + 0x230) + 8);
  }
  *eventEndPP = s;
  eventPP = nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)enc;
  enc_local._4_4_ = startTagLevel;
  pvStack_18 = parser;
  do {
    pcStack_58 = end_local;
    name._4_4_ = (**(code **)(s_local + 8))
                           (s_local,end_local,nextPtr_local,&stack0xffffffffffffffa8);
    *(char **)next = pcStack_58;
    switch(name._4_4_) {
    case 0:
      *eventEndPP = pcStack_58;
      return XML_ERROR_INVALID_TOKEN;
    case 1:
      if (*(long *)((long)pvStack_18 + 0x68) == 0) {
        XVar4 = storeAtts(pvStack_18,(ENCODING *)s_local,end_local,(TAG_NAME *)0x0,(BINDING **)0x0);
        if (XVar4 != XML_ERROR_NONE) {
          return XVar4;
        }
        tag._4_4_ = 0;
      }
    case 2:
      if (*(long *)((long)pvStack_18 + 0x3d8) == 0) {
        _result_2 = (undefined8 *)(**(code **)((long)pvStack_18 + 0x18))(0x48);
        if (_result_2 == (undefined8 *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        uVar8 = (**(code **)((long)pvStack_18 + 0x18))(0x20);
        _result_2[6] = uVar8;
        if (_result_2[6] == 0) {
          return XML_ERROR_NO_MEMORY;
        }
        _result_2[7] = _result_2[6] + 0x20;
      }
      else {
        _result_2 = *(undefined8 **)((long)pvStack_18 + 0x3d8);
        *(undefined8 *)((long)pvStack_18 + 0x3d8) = **(undefined8 **)((long)pvStack_18 + 0x3d8);
      }
      _result_2[8] = 0;
      *_result_2 = *(undefined8 *)((long)pvStack_18 + 0x3d0);
      *(undefined8 **)((long)pvStack_18 + 0x3d0) = _result_2;
      _result_2[4] = 0;
      _result_2[1] = end_local + *(int *)(s_local + 0x88);
      uVar5 = (**(code **)(s_local + 0x40))(s_local,_result_2[1]);
      *(undefined4 *)(_result_2 + 2) = uVar5;
      if (eventPP != (char **)0x0) {
        if ((long)(_result_2[7] - _result_2[6]) < (long)(*(int *)(_result_2 + 2) + 1)) {
          toPtr._4_4_ = *(int *)(_result_2 + 2) << 2;
          uVar8 = (**(code **)((long)pvStack_18 + 0x20))(_result_2[6],(long)toPtr._4_4_);
          _result_2[6] = uVar8;
          if (_result_2[6] == 0) {
            return XML_ERROR_NO_MEMORY;
          }
          _result_2[7] = _result_2[6] + (long)toPtr._4_4_;
        }
        memcpy((void *)_result_2[6],(void *)_result_2[1],(long)*(int *)(_result_2 + 2));
        _result_2[1] = _result_2[6];
      }
      *(int *)((long)pvStack_18 + 0x23c) = *(int *)((long)pvStack_18 + 0x23c) + 1;
      if (*(long *)((long)pvStack_18 + 0x68) == 0) {
        _result_2[3] = 0;
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        while( true ) {
          fromPtr = (char *)(_result_2[1] + (long)*(int *)(_result_2 + 2));
          _result_3 = (char *)_result_2[1];
          if (eventPP == (char **)0x0) {
            rawNameEnd = (char *)_result_2[6];
          }
          else {
            rawNameEnd = (char *)(_result_2[6] + (long)*(int *)(_result_2 + 2));
          }
          _result_2[3] = rawNameEnd;
          (**(code **)(s_local + 0x78))(s_local,&result_3,fromPtr,&rawNameEnd,_result_2[7] + -1);
          if (_result_3 == fromPtr) break;
          iVar6 = ((int)_result_2[7] - (int)_result_2[6]) * 2;
          uVar8 = (**(code **)((long)pvStack_18 + 0x20))(_result_2[6],(long)iVar6);
          _result_2[6] = uVar8;
          if (_result_2[6] == 0) {
            return XML_ERROR_NO_MEMORY;
          }
          _result_2[7] = _result_2[6] + (long)iVar6;
          if (eventPP != (char **)0x0) {
            _result_2[1] = _result_2[6];
          }
        }
        *rawNameEnd = '\0';
        toPtr._0_4_ = storeAtts(pvStack_18,(ENCODING *)s_local,end_local,(TAG_NAME *)(_result_2 + 3)
                                ,(BINDING **)(_result_2 + 8));
        if ((XML_Error)toPtr != XML_ERROR_NONE) {
          return (XML_Error)toPtr;
        }
        (**(code **)((long)pvStack_18 + 0x68))
                  (*(undefined8 *)((long)pvStack_18 + 8),_result_2[3],
                   *(undefined8 *)((long)pvStack_18 + 0x400));
        poolClear((STRING_POOL *)((long)pvStack_18 + 0x418));
      }
      break;
    case 3:
      if ((*(long *)((long)pvStack_18 + 0x68) == 0) &&
         (XVar4 = storeAtts(pvStack_18,(ENCODING *)s_local,end_local,(TAG_NAME *)0x0,(BINDING **)0x0
                           ), XVar4 != XML_ERROR_NONE)) {
        return XVar4;
      }
    case 4:
      pcVar9 = s_local;
      if ((*(long *)((long)pvStack_18 + 0x68) == 0) && (*(long *)((long)pvStack_18 + 0x70) == 0)) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        ptr = end_local + *(int *)(s_local + 0x88);
        name_1.uriLen = 0;
        name_1._20_4_ = 0;
        pool = (STRING_POOL *)((long)pvStack_18 + 0x418);
        iVar6 = (**(code **)(s_local + 0x40))(s_local,ptr);
        b = (BINDING *)poolStoreString(pool,(ENCODING *)pcVar9,ptr,ptr + iVar6);
        if (b == (BINDING *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        *(undefined8 *)((long)pvStack_18 + 0x438) = *(undefined8 *)((long)pvStack_18 + 0x430);
        XVar4 = storeAtts(pvStack_18,(ENCODING *)s_local,end_local,(TAG_NAME *)&b,
                          (BINDING **)&name_1.uriLen);
        if (XVar4 != XML_ERROR_NONE) {
          return XVar4;
        }
        *(undefined8 *)((long)pvStack_18 + 0x438) = *(undefined8 *)((long)pvStack_18 + 0x430);
        if (*(long *)((long)pvStack_18 + 0x68) != 0) {
          (**(code **)((long)pvStack_18 + 0x68))
                    (*(undefined8 *)((long)pvStack_18 + 8),b,
                     *(undefined8 *)((long)pvStack_18 + 0x400));
        }
        if (*(long *)((long)pvStack_18 + 0x70) != 0) {
          if (*(long *)((long)pvStack_18 + 0x68) != 0) {
            *eventEndPP = *(char **)next;
          }
          (**(code **)((long)pvStack_18 + 0x70))(*(undefined8 *)((long)pvStack_18 + 8),b);
        }
        poolClear((STRING_POOL *)((long)pvStack_18 + 0x418));
        while (uVar8 = name_1._16_8_, name_1._16_8_ != 0) {
          if (*(long *)((long)pvStack_18 + 0xd0) != 0) {
            (**(code **)((long)pvStack_18 + 0xd0))
                      (*(undefined8 *)((long)pvStack_18 + 8),**(undefined8 **)name_1._16_8_);
          }
          name_1._16_8_ = *(undefined8 *)(name_1._16_8_ + 8);
          *(undefined8 *)(uVar8 + 8) = *(undefined8 *)((long)pvStack_18 + 1000);
          *(undefined8 *)((long)pvStack_18 + 1000) = uVar8;
          *(undefined8 *)(*(long *)uVar8 + 8) = *(undefined8 *)(uVar8 + 0x10);
        }
      }
      if (*(int *)((long)pvStack_18 + 0x23c) == 0) {
        XVar4 = epilogProcessor(pvStack_18,pcStack_58,(char *)nextPtr_local,eventPP);
        return XVar4;
      }
      break;
    case 5:
      if (*(int *)((long)pvStack_18 + 0x23c) == enc_local._4_4_) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      puVar2 = *(undefined8 **)((long)pvStack_18 + 0x3d0);
      *(undefined8 *)((long)pvStack_18 + 0x3d0) = *puVar2;
      *puVar2 = *(undefined8 *)((long)pvStack_18 + 0x3d8);
      *(undefined8 **)((long)pvStack_18 + 0x3d8) = puVar2;
      pcVar9 = end_local + (*(int *)(s_local + 0x88) << 1);
      iVar6 = (**(code **)(s_local + 0x40))(s_local,pcVar9);
      if ((iVar6 != *(int *)(puVar2 + 2)) ||
         (iVar6 = memcmp((void *)puVar2[1],pcVar9,(long)iVar6), iVar6 != 0)) {
        *eventEndPP = pcVar9;
        return XML_ERROR_TAG_MISMATCH;
      }
      *(int *)((long)pvStack_18 + 0x23c) = *(int *)((long)pvStack_18 + 0x23c) + -1;
      if ((*(long *)((long)pvStack_18 + 0x70) == 0) || (puVar2[3] == 0)) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        if (puVar2[4] != 0) {
          b_1 = (BINDING *)puVar2[4];
          from = (XML_Char *)(puVar2[3] + (long)*(int *)(puVar2 + 5));
          do {
            cVar1 = *(char *)&b_1->prefix;
            *from = cVar1;
            b_1 = (BINDING *)((long)&b_1->prefix + 1);
            from = from + 1;
          } while (cVar1 != '\0');
        }
        (**(code **)((long)pvStack_18 + 0x70))(*(undefined8 *)((long)pvStack_18 + 8),puVar2[3]);
      }
      while (puVar2[8] != 0) {
        _buf = (long *)puVar2[8];
        if (*(long *)((long)pvStack_18 + 0xd0) != 0) {
          (**(code **)((long)pvStack_18 + 0xd0))
                    (*(undefined8 *)((long)pvStack_18 + 8),*(undefined8 *)*_buf);
        }
        puVar2[8] = *(undefined8 *)(puVar2[8] + 8);
        _buf[1] = *(long *)((long)pvStack_18 + 1000);
        *(long **)((long)pvStack_18 + 1000) = _buf;
        *(long *)(*_buf + 8) = _buf[2];
      }
      if (*(int *)((long)pvStack_18 + 0x23c) == 0) {
        XVar4 = epilogProcessor(pvStack_18,pcStack_58,(char *)nextPtr_local,eventPP);
        return XVar4;
      }
      break;
    case 6:
      if (*(long *)((long)pvStack_18 + 0x78) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else if (s_local[0x8c] == '\0') {
        while( true ) {
          local_160 = *(long *)((long)pvStack_18 + 0x58);
          (**(code **)(s_local + 0x78))
                    (s_local,&end_local,pcStack_58,&local_160,
                     *(undefined8 *)((long)pvStack_18 + 0x60));
          *(char **)next = end_local;
          (**(code **)((long)pvStack_18 + 0x78))
                    (*(undefined8 *)((long)pvStack_18 + 8),*(undefined8 *)((long)pvStack_18 + 0x58),
                     local_160 - *(long *)((long)pvStack_18 + 0x58) & 0xffffffff);
          if (end_local == pcStack_58) break;
          *eventEndPP = end_local;
        }
      }
      else {
        (**(code **)((long)pvStack_18 + 0x78))
                  (*(undefined8 *)((long)pvStack_18 + 8),end_local,
                   (long)pcStack_58 - (long)end_local & 0xffffffff);
      }
      break;
    case 7:
      if (*(long *)((long)pvStack_18 + 0x78) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        dataPtr._7_1_ = 10;
        (**(code **)((long)pvStack_18 + 0x78))
                  (*(undefined8 *)((long)pvStack_18 + 8),(long)&dataPtr + 7,1);
      }
      break;
    case 8:
      if (*(long *)((long)pvStack_18 + 0x90) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        (**(code **)((long)pvStack_18 + 0x90))(*(undefined8 *)((long)pvStack_18 + 8));
      }
      dataPtr._0_4_ =
           doCdataSection(pvStack_18,(ENCODING *)s_local,&stack0xffffffffffffffa8,
                          (char *)nextPtr_local,eventPP);
      if (pcStack_58 == (char *)0x0) {
        *(code **)((long)pvStack_18 + 0x208) = cdataSectionProcessor;
        return (XML_Error)dataPtr;
      }
      break;
    case 9:
      openEntity.entity._7_1_ =
           (**(code **)(s_local + 0x60))
                     (s_local,end_local + *(int *)(s_local + 0x88),
                      (long)pcStack_58 - (long)*(int *)(s_local + 0x88));
      if (openEntity.entity._7_1_ == '\0') {
        name_00 = poolStoreString((STRING_POOL *)((long)pvStack_18 + 0x330),(ENCODING *)s_local,
                                  end_local + *(int *)(s_local + 0x88),
                                  pcStack_58 + -(long)*(int *)(s_local + 0x88));
        if (name_00 == (XML_Char *)0x0) {
          return XML_ERROR_NO_MEMORY;
        }
        poVar7 = (open_internal_entity *)lookup((HASH_TABLE *)((long)pvStack_18 + 0x290),name_00,0);
        *(undefined8 *)((long)pvStack_18 + 0x348) = *(undefined8 *)((long)pvStack_18 + 0x350);
        if (poVar7 == (open_internal_entity *)0x0) {
          if ((*(int *)((long)pvStack_18 + 0x360) != 0) || (*(int *)((long)pvStack_18 + 0x364) != 0)
             ) {
            return XML_ERROR_UNDEFINED_ENTITY;
          }
          if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
            reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
          }
        }
        else {
          if (*(char *)&poVar7[1].entity != '\0') {
            return XML_ERROR_RECURSIVE_ENTITY_REF;
          }
          if (poVar7[1].next != (open_internal_entity *)0x0) {
            return XML_ERROR_BINARY_ENTITY_REF;
          }
          if (poVar7 != (open_internal_entity *)0x0) {
            if (poVar7->internalEventEndPtr == (char *)0x0) {
              if (*(long *)((long)pvStack_18 + 0xe0) == 0) {
                if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
                  reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
                }
              }
              else {
                *(undefined1 *)&poVar7[1].entity = 1;
                pXStack_a0 = getContext(pvStack_18);
                *(undefined1 *)&poVar7[1].entity = 0;
                if (pXStack_a0 == (XML_Char *)0x0) {
                  return XML_ERROR_NO_MEMORY;
                }
                iVar6 = (**(code **)((long)pvStack_18 + 0xe0))
                                  (*(undefined8 *)((long)pvStack_18 + 0xe8),pXStack_a0,
                                   poVar7[1].internalEventPtr,poVar7->entity,
                                   poVar7[1].internalEventEndPtr);
                if (iVar6 == 0) {
                  return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
                }
                *(undefined8 *)((long)pvStack_18 + 0x430) =
                     *(undefined8 *)((long)pvStack_18 + 0x438);
              }
            }
            else if ((*(long *)((long)pvStack_18 + 0xa0) == 0) ||
                    (*(int *)((long)pvStack_18 + 0x238) != 0)) {
              *(undefined1 *)&poVar7[1].entity = 1;
              openEntity.internalEventEndPtr = *(char **)((long)pvStack_18 + 0x230);
              *(XML_Char ***)((long)pvStack_18 + 0x230) = &context;
              context = (XML_Char *)0x0;
              openEntity.internalEventPtr = (char *)0x0;
              openEntity.next = poVar7;
              XVar4 = doContent(pvStack_18,*(int *)((long)pvStack_18 + 0x23c),
                                *(ENCODING **)((long)pvStack_18 + 0x1b8),poVar7->internalEventEndPtr
                                ,poVar7->internalEventEndPtr + *(int *)&poVar7->next,(char **)0x0);
              *(undefined1 *)&poVar7[1].entity = 0;
              *(char **)((long)pvStack_18 + 0x230) = openEntity.internalEventEndPtr;
              if (XVar4 != XML_ERROR_NONE) {
                return XVar4;
              }
              openEntity.entity._0_4_ = 0;
            }
            else {
              reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
            }
          }
        }
      }
      else if (*(long *)((long)pvStack_18 + 0x78) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        (**(code **)((long)pvStack_18 + 0x78))
                  (*(undefined8 *)((long)pvStack_18 + 8),
                   (undefined1 *)((long)&openEntity.entity + 7),1);
      }
      break;
    case 10:
      iStack_144 = (**(code **)(s_local + 0x58))(s_local,end_local);
      if (iStack_144 < 0) {
        return XML_ERROR_BAD_CHAR_REF;
      }
      if (*(long *)((long)pvStack_18 + 0x78) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
        }
      }
      else {
        pcVar3 = *(code **)((long)pvStack_18 + 0x78);
        uVar8 = *(undefined8 *)((long)pvStack_18 + 8);
        iVar6 = cm_expat_XmlUtf8Encode(iStack_144,(char *)&result_5);
        (*pcVar3)(uVar8,&result_5,iVar6);
      }
      break;
    case 0xb:
      iVar6 = reportProcessingInstruction(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
      if (iVar6 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xc:
      return XML_ERROR_MISPLACED_XML_PI;
    case 0xd:
      iVar6 = reportComment(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
      if (iVar6 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      break;
    case 0xfffffffb:
      if (eventPP == (char **)0x0) {
        if (*(long *)((long)pvStack_18 + 0x78) == 0) {
          if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
            reportDefault(pvStack_18,(ENCODING *)s_local,end_local,(char *)nextPtr_local);
          }
        }
        else if (s_local[0x8c] == '\0') {
          dataPtr_1 = *(ICHAR **)((long)pvStack_18 + 0x58);
          (**(code **)(s_local + 0x78))
                    (s_local,&end_local,nextPtr_local,&dataPtr_1,
                     *(undefined8 *)((long)pvStack_18 + 0x60));
          (**(code **)((long)pvStack_18 + 0x78))
                    (*(undefined8 *)((long)pvStack_18 + 8),*(undefined8 *)((long)pvStack_18 + 0x58),
                     (long)dataPtr_1 - *(long *)((long)pvStack_18 + 0x58) & 0xffffffff);
        }
        else {
          (**(code **)((long)pvStack_18 + 0x78))
                    (*(undefined8 *)((long)pvStack_18 + 8),end_local,
                     (long)nextPtr_local - (long)end_local & 0xffffffff);
        }
        if (enc_local._4_4_ == 0) {
          *eventEndPP = (char *)nextPtr_local;
          parser_local._4_4_ = XML_ERROR_NO_ELEMENTS;
        }
        else if (*(int *)((long)pvStack_18 + 0x23c) == enc_local._4_4_) {
          parser_local._4_4_ = XML_ERROR_NONE;
        }
        else {
          *eventEndPP = (char *)nextPtr_local;
          parser_local._4_4_ = XML_ERROR_ASYNC_ENTITY;
        }
      }
      else {
        *eventPP = end_local;
        parser_local._4_4_ = XML_ERROR_NONE;
      }
      return parser_local._4_4_;
    case 0xfffffffc:
      if (eventPP != (char **)0x0) {
        *eventPP = end_local;
        return XML_ERROR_NONE;
      }
      if (0 < enc_local._4_4_) {
        if (*(int *)((long)pvStack_18 + 0x23c) != enc_local._4_4_) {
          return XML_ERROR_ASYNC_ENTITY;
        }
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case 0xfffffffd:
      if (eventPP != (char **)0x0) {
        *eventPP = end_local;
        return XML_ERROR_NONE;
      }
      *(char ***)next = nextPtr_local;
      if (*(long *)((long)pvStack_18 + 0x78) == 0) {
        if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
          reportDefault(pvStack_18,(ENCODING *)s_local,end_local,(char *)nextPtr_local);
        }
      }
      else {
        name._3_1_ = 10;
        (**(code **)((long)pvStack_18 + 0x78))
                  (*(undefined8 *)((long)pvStack_18 + 8),(long)&name + 3,1);
      }
      if (enc_local._4_4_ == 0) {
        return XML_ERROR_NO_ELEMENTS;
      }
      if (*(int *)((long)pvStack_18 + 0x23c) != enc_local._4_4_) {
        return XML_ERROR_ASYNC_ENTITY;
      }
      return XML_ERROR_NONE;
    case 0xfffffffe:
      if (eventPP != (char **)0x0) {
        *eventPP = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case 0xffffffff:
      if (eventPP != (char **)0x0) {
        *eventPP = end_local;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    default:
      if (*(long *)((long)pvStack_18 + 0xa0) != 0) {
        reportDefault(pvStack_18,(ENCODING *)s_local,end_local,pcStack_58);
      }
    }
    end_local = pcStack_58;
    *eventEndPP = pcStack_58;
  } while( true );
}

Assistant:

static enum XML_Error
doContent(XML_Parser parser,
          int startTagLevel,
          const ENCODING *enc,
          const char *s,
          const char *end,
          const char **nextPtr)
{
  const char **eventPP;
  const char **eventEndPP;
  if (enc == encoding) {
    eventPP = &eventPtr;
    eventEndPP = &eventEndPtr;
  }
  else {
    eventPP = &(openInternalEntities->internalEventPtr);
    eventEndPP = &(openInternalEntities->internalEventEndPtr);
  }
  *eventPP = s;
  for (;;) {
    const char *next = s; /* XmlContentTok doesn't always set the last arg */
    int tok = XmlContentTok(enc, s, end, &next);
    *eventEndPP = next;
    switch (tok) {
    case XML_TOK_TRAILING_CR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      *eventEndPP = end;
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0)
        return XML_ERROR_NO_ELEMENTS;
      if (tagLevel != startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (startTagLevel > 0) {
        if (tagLevel != startTagLevel)
          return XML_ERROR_ASYNC_ENTITY;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_NO_ELEMENTS;
    case XML_TOK_INVALID:
      *eventPP = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              s + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (characterDataHandler)
            characterDataHandler(handlerArg, &ch, 1);
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        name = poolStoreString(&dtd.pool, enc,
                                s + enc->minBytesPerChar,
                                next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&dtd.pool);
        if (!entity) {
          if (dtd.complete || dtd.standalone)
            return XML_ERROR_UNDEFINED_ENTITY;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
          break;
        }
        if (entity->open)
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        if (entity->notation)
          return XML_ERROR_BINARY_ENTITY_REF;
        if (entity) {
          if (entity->textPtr) {
            enum XML_Error result;
            OPEN_INTERNAL_ENTITY openEntity;
            if (defaultHandler && !defaultExpandInternalEntities) {
              reportDefault(parser, enc, s, next);
              break;
            }
            entity->open = 1;
            openEntity.next = openInternalEntities;
            openInternalEntities = &openEntity;
            openEntity.entity = entity;
            openEntity.internalEventPtr = 0;
            openEntity.internalEventEndPtr = 0;
            result = doContent(parser,
                               tagLevel,
                               internalEncoding,
                               (char *)entity->textPtr,
                               (char *)(entity->textPtr + entity->textLen),
                               0);
            entity->open = 0;
            openInternalEntities = openEntity.next;
            if (result)
              return result;
          }
          else if (externalEntityRefHandler) {
            const XML_Char *context;
            entity->open = 1;
            context = getContext(parser);
            entity->open = 0;
            if (!context)
              return XML_ERROR_NO_MEMORY;
            if (!externalEntityRefHandler(externalEntityRefHandlerArg,
                                          context,
                                          entity->base,
                                          entity->systemId,
                                          entity->publicId))
              return XML_ERROR_EXTERNAL_ENTITY_HANDLING;
            poolDiscard(&tempPool);
          }
          else if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_START_TAG_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_START_TAG_NO_ATTS:
      {
        TAG *tag;
        if (freeTagList) {
          tag = freeTagList;
          freeTagList = freeTagList->parent;
        }
        else {
          tag = MALLOC(sizeof(TAG));
          if (!tag)
            return XML_ERROR_NO_MEMORY;
          tag->buf = MALLOC(INIT_TAG_BUF_SIZE);
          if (!tag->buf)
            return XML_ERROR_NO_MEMORY;
          tag->bufEnd = tag->buf + INIT_TAG_BUF_SIZE;
        }
        tag->bindings = 0;
        tag->parent = tagStack;
        tagStack = tag;
        tag->name.localPart = 0;
        tag->rawName = s + enc->minBytesPerChar;
        tag->rawNameLength = XmlNameLength(enc, tag->rawName);
        if (nextPtr) {
          /* Need to guarantee that:
             tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)) <= tag->bufEnd - sizeof(XML_Char) */
          if (tag->rawNameLength + (int)(sizeof(XML_Char) - 1) + (int)sizeof(XML_Char) > tag->bufEnd - tag->buf) {
            int bufSize = tag->rawNameLength * 4;
            bufSize = ROUND_UP(bufSize, sizeof(XML_Char));
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
          }
          memcpy(tag->buf, tag->rawName, tag->rawNameLength);
          tag->rawName = tag->buf;
        }
        ++tagLevel;
        if (startElementHandler) {
          enum XML_Error result;
          XML_Char *toPtr;
          for (;;) {
            const char *rawNameEnd = tag->rawName + tag->rawNameLength;
            const char *fromPtr = tag->rawName;
            int bufSize;
            if (nextPtr)
              toPtr = (XML_Char *)(tag->buf + ROUND_UP(tag->rawNameLength, sizeof(XML_Char)));
            else
              toPtr = (XML_Char *)tag->buf;
            tag->name.str = toPtr;
            XmlConvert(enc,
                       &fromPtr, rawNameEnd,
                       (ICHAR **)&toPtr, (ICHAR *)tag->bufEnd - 1);
            if (fromPtr == rawNameEnd)
              break;
            bufSize = (tag->bufEnd - tag->buf) << 1;
            tag->buf = REALLOC(tag->buf, bufSize);
            if (!tag->buf)
              return XML_ERROR_NO_MEMORY;
            tag->bufEnd = tag->buf + bufSize;
            if (nextPtr)
              tag->rawName = tag->buf;
          }
          *toPtr = XML_T('\0');
          result = storeAtts(parser, enc, s, &(tag->name), &(tag->bindings));
          if (result)
            return result;
          startElementHandler(handlerArg, tag->name.str, (const XML_Char **)atts);
          poolClear(&tempPool);
        }
        else {
          tag->name.str = 0;
          if (defaultHandler)
            reportDefault(parser, enc, s, next);
        }
        break;
      }
    case XML_TOK_EMPTY_ELEMENT_WITH_ATTS:
      if (!startElementHandler) {
        enum XML_Error result = storeAtts(parser, enc, s, 0, 0);
        if (result)
          return result;
      }
      /* fall through */
    case XML_TOK_EMPTY_ELEMENT_NO_ATTS:
      if (startElementHandler || endElementHandler) {
        const char *rawName = s + enc->minBytesPerChar;
        enum XML_Error result;
        BINDING *bindings = 0;
        TAG_NAME name;
        name.str = poolStoreString(&tempPool, enc, rawName,
                                   rawName + XmlNameLength(enc, rawName));
        if (!name.str)
          return XML_ERROR_NO_MEMORY;
        poolFinish(&tempPool);
        result = storeAtts(parser, enc, s, &name, &bindings);
        if (result)
          return result;
        poolFinish(&tempPool);
        if (startElementHandler)
          startElementHandler(handlerArg, name.str, (const XML_Char **)atts);
        if (endElementHandler) {
          if (startElementHandler)
            *eventPP = *eventEndPP;
          endElementHandler(handlerArg, name.str);
        }
        poolClear(&tempPool);
        while (bindings) {
          BINDING *b = bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          bindings = bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      if (tagLevel == 0)
        return epilogProcessor(parser, next, end, nextPtr);
      break;
    case XML_TOK_END_TAG:
      if (tagLevel == startTagLevel)
        return XML_ERROR_ASYNC_ENTITY;
      else {
        int len;
        const char *rawName;
        TAG *tag = tagStack;
        tagStack = tag->parent;
        tag->parent = freeTagList;
        freeTagList = tag;
        rawName = s + enc->minBytesPerChar*2;
        len = XmlNameLength(enc, rawName);
        if (len != tag->rawNameLength
            || memcmp(tag->rawName, rawName, len) != 0) {
          *eventPP = rawName;
          return XML_ERROR_TAG_MISMATCH;
        }
        --tagLevel;
        if (endElementHandler && tag->name.str) {
          if (tag->name.localPart) {
            XML_Char *to = (XML_Char *)tag->name.str + tag->name.uriLen;
            const XML_Char *from = tag->name.localPart;
            while ((*to++ = *from++) != 0)
              ;
          }
          endElementHandler(handlerArg, tag->name.str);
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        while (tag->bindings) {
          BINDING *b = tag->bindings;
          if (endNamespaceDeclHandler)
            endNamespaceDeclHandler(handlerArg, b->prefix->name);
          tag->bindings = tag->bindings->nextTagBinding;
          b->nextTagBinding = freeBindingList;
          freeBindingList = b;
          b->prefix->binding = b->prevPrefixBinding;
        }
        if (tagLevel == 0)
          return epilogProcessor(parser, next, end, nextPtr);
      }
      break;
    case XML_TOK_CHAR_REF:
      {
        int n = XmlCharRefNumber(enc, s);
        if (n < 0)
          return XML_ERROR_BAD_CHAR_REF;
        if (characterDataHandler) {
          XML_Char buf[XML_ENCODE_MAX];
          characterDataHandler(handlerArg, buf, XmlEncode(n, (ICHAR *)buf));
        }
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
      }
      break;
    case XML_TOK_XML_DECL:
      return XML_ERROR_MISPLACED_XML_PI;
    case XML_TOK_DATA_NEWLINE:
      if (characterDataHandler) {
        XML_Char c = 0xA;
        characterDataHandler(handlerArg, &c, 1);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_CDATA_SECT_OPEN:
      {
        enum XML_Error result;
        if (startCdataSectionHandler)
          startCdataSectionHandler(handlerArg);
#if 0
        /* Suppose you doing a transformation on a document that involves
           changing only the character data.  You set up a defaultHandler
           and a characterDataHandler.  The defaultHandler simply copies
           characters through.  The characterDataHandler does the transformation
           and writes the characters out escaping them as necessary.  This case
           will fail to work if we leave out the following two lines (because &
           and < inside CDATA sections will be incorrectly escaped).

           However, now we have a start/endCdataSectionHandler, so it seems
           easier to let the user deal with this. */

        else if (characterDataHandler)
          characterDataHandler(handlerArg, dataBuf, 0);
#endif
        else if (defaultHandler)
          reportDefault(parser, enc, s, next);
        result = doCdataSection(parser, enc, &next, end, nextPtr);
        if (!next) {
          processor = cdataSectionProcessor;
          return result;
        }
      }
      break;
    case XML_TOK_TRAILING_RSQB:
      if (nextPtr) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          ICHAR *dataPtr = (ICHAR *)dataBuf;
          XmlConvert(enc, &s, end, &dataPtr, (ICHAR *)dataBufEnd);
          characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)end - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, end);
      if (startTagLevel == 0) {
        *eventPP = end;
        return XML_ERROR_NO_ELEMENTS;
      }
      if (tagLevel != startTagLevel) {
        *eventPP = end;
        return XML_ERROR_ASYNC_ENTITY;
      }
      return XML_ERROR_NONE;
    case XML_TOK_DATA_CHARS:
      if (characterDataHandler) {
        if (MUST_CONVERT(enc, s)) {
          for (;;) {
            ICHAR *dataPtr = (ICHAR *)dataBuf;
            XmlConvert(enc, &s, next, &dataPtr, (ICHAR *)dataBufEnd);
            *eventEndPP = s;
            characterDataHandler(handlerArg, dataBuf, dataPtr - (ICHAR *)dataBuf);
            if (s == next)
              break;
            *eventPP = s;
          }
        }
        else
          characterDataHandler(handlerArg,
                               (XML_Char *)s,
                               (XML_Char *)next - (XML_Char *)s);
      }
      else if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, enc, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    default:
      if (defaultHandler)
        reportDefault(parser, enc, s, next);
      break;
    }
    *eventPP = s = next;
  }
  /* not reached */
}